

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

void __thiscall ProcessThread::run(ProcessThread *this)

{
  _Base_ptr p_Var1;
  int iVar2;
  Process *this_00;
  _Base_ptr *pp_Var3;
  uint uVar4;
  _Atomic_word _Var5;
  ssize_t sVar6;
  iterator iVar7;
  uint *puVar8;
  int *piVar9;
  Event *event;
  _Base_ptr p_Var10;
  iterator __position;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  EventLoop *this_02;
  bool bVar11;
  char ch;
  int ret;
  pid_t p;
  unique_lock<std::mutex> lock;
  char local_91;
  uint local_90;
  __pid_t local_8c;
  unique_lock<std::mutex> local_88;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_78;
  Log local_70;
  Log local_60;
  Log local_50;
  Log local_40;
  
  do {
    do {
      sVar6 = read(sProcessPipe[0],&local_91,1);
    } while (sVar6 != 1);
    if (local_91 == 's') {
      return;
    }
    local_88._M_device = &sProcessMutex;
    local_88._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_88);
    local_88._M_owns = true;
LAB_0017095b:
    do {
      local_8c = waitpid(0,(int *)&local_90,1);
      if (local_8c != -1) {
        if (local_8c == 0) goto LAB_00170be2;
        local_90 = -(uint)((local_90 & 0x7f) != 0) | local_90 >> 8 & 0xff;
        p_Var10 = sProcesses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        __position._M_node = &sProcesses._M_t._M_impl.super__Rb_tree_header._M_header;
        if (sProcesses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001709d9:
          if (sPending != 0) {
            iVar7 = std::
                    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&sPendingPids._M_h,&local_8c);
            uVar4 = local_90;
            if (iVar7.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur !=
                (__node_type *)0x0) {
              __assert_fail("sPendingPids.find(p) == sPendingPids.end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                            ,0xcc,"virtual void ProcessThread::run()");
            }
            puVar8 = (uint *)std::__detail::
                             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)&sPendingPids,&local_8c);
            *puVar8 = uVar4;
            goto LAB_0017095b;
          }
          local_78.mValue = 1;
          Log::Log(&local_70,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_78);
          Log::write(&local_60,(int)&local_70,"couldn\'t find process for pid",0xffffffff);
          Log::addStringStream<int>(&local_50,(int)&local_60);
          if (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          this_01._M_pi =
               local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          if (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            this_01._M_pi =
                 local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
        }
        else {
          do {
            p_Var1 = p_Var10 + 1;
            if (local_8c <= (int)p_Var1->_M_color) {
              __position._M_node = p_Var10;
            }
            pp_Var3 = &p_Var10->_M_left;
            p_Var10 = pp_Var3[(int)p_Var1->_M_color < local_8c];
          } while (pp_Var3[(int)p_Var1->_M_color < local_8c] != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)__position._M_node ==
               &sProcesses._M_t._M_impl.super__Rb_tree_header) ||
             (local_8c < (int)__position._M_node[1]._M_color)) goto LAB_001709d9;
          this_00 = (Process *)__position._M_node[1]._M_parent;
          if (this_00 == (Process *)0x0) goto LAB_0017095b;
          this_01._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__position._M_node[1]._M_right;
          if ((_Base_ptr)this_01._M_pi == (_Base_ptr)0x0) {
LAB_00170ae5:
            this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00170ae8:
            this_02 = (EventLoop *)0x0;
          }
          else {
            _Var5 = *(_Atomic_word *)&((_Base_ptr)this_01._M_pi)->_M_parent;
            do {
              if (_Var5 == 0) goto LAB_00170ae5;
              LOCK();
              iVar2 = *(int *)&((_Base_ptr)this_01._M_pi)->_M_parent;
              bVar11 = _Var5 == iVar2;
              if (bVar11) {
                *(_Atomic_word *)&((_Base_ptr)this_01._M_pi)->_M_parent = _Var5 + 1;
                iVar2 = _Var5;
              }
              _Var5 = iVar2;
              UNLOCK();
            } while (!bVar11);
            if (*(int *)&((_Base_ptr)this_01._M_pi)->_M_parent == 0) goto LAB_00170ae8;
            this_02 = (EventLoop *)__position._M_node[1]._M_left;
          }
          std::
          _Rb_tree<int,std::pair<int_const,ProcessThread::ProcessData>,std::_Select1st<std::pair<int_const,ProcessThread::ProcessData>>,std::less<int>,std::allocator<std::pair<int_const,ProcessThread::ProcessData>>>
          ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,ProcessThread::ProcessData>,std::_Select1st<std::pair<int_const,ProcessThread::ProcessData>>,std::less<int>,std::allocator<std::pair<int_const,ProcessThread::ProcessData>>>
                              *)&sProcesses,__position);
          std::unique_lock<std::mutex>::unlock(&local_88);
          uVar4 = local_90;
          if (this_02 == (EventLoop *)0x0) {
            Process::finish(this_00,local_90);
          }
          else {
            event = (Event *)operator_new(0x20);
            event->_vptr_Event = (_func_int **)&PTR__Event_001907e8;
            event[1]._vptr_Event = (_func_int **)this_00;
            *(uint *)&event[2]._vptr_Event = uVar4;
            EventLoop::post(this_02,event);
          }
          std::unique_lock<std::mutex>::lock(&local_88);
        }
        if ((_Base_ptr)this_01._M_pi != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        }
        goto LAB_0017095b;
      }
      piVar9 = __errno_location();
    } while (*piVar9 == 4);
    if (*piVar9 != 10) {
      local_78.mValue = 1;
      Log::Log(&local_70,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_78);
      Log::write(&local_60,(int)&local_70,"waitpid error",0xffffffff);
      Log::addStringStream<int>(&local_40,(int)&local_60);
      if (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Base_ptr)
          local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
LAB_00170be2:
    std::unique_lock<std::mutex>::~unique_lock(&local_88);
  } while( true );
}

Assistant:

void ProcessThread::run()
{
    ssize_t r;
    for (;;) {
        char ch;
        r = ::read(sProcessPipe[0], &ch, sizeof(char));
        if (r == 1) {
            if (ch == 's') {
                break;
            } else {
                int ret;
                pid_t p;
                std::unique_lock<std::mutex> lock(sProcessMutex);
                bool done = false;
                do {
                    // find out which process we're waking up on
                    eintrwrap(p, ::waitpid(0, &ret, WNOHANG));
                    switch (p) {
                    case 0:
                        // we're done
                        done = true;
                        break;
                    case -1:
                        done = true;
                        if (errno == ECHILD)
                            break;
                        // this is bad
                        error() << "waitpid error" << errno;
                        break;
                    default:
                        // printf("successfully waited for pid (got %d)\n", p);
                        // child process with pid=p just exited.
                        if (WIFEXITED(ret)) {
                            ret = WEXITSTATUS(ret);
                        } else {
                            ret = Process::ReturnCrashed;
                        }
                        // find the process object to this child process
                        auto proc = sProcesses.find(p);
                        if (proc != sProcesses.end()) {
                            Process *process = proc->second.proc;
                            if (process != nullptr) {
                                EventLoop::SharedPtr loop = proc->second.loop.lock();
                                sProcesses.erase(proc++);
                                lock.unlock();
                                if (loop) {
                                    loop->callLater([process, ret]() { process->finish(ret); });
                                } else {
                                    process->finish(ret);
                                }
                                lock.lock();
                            }
                        } else {
                            if (sPending) {
                                assert(sPendingPids.find(p) == sPendingPids.end());
                                sPendingPids[p] = ret;
                            } else {
                                error() << "couldn't find process for pid" << p;
                            }
                        }
                    }
                } while (!done);
            }
        }
    }
    // printf("process thread died for some reason\n");
}